

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockFormerVisitor.cpp
# Opt level: O3

void __thiscall
IRT::BlockFormerVisitor::Visit
          (BlockFormerVisitor *this,JumpConditionalStatement *jump_conditional_statement)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  LogicOperatorType type;
  pointer pcVar2;
  JumpConditionalStatement *this_00;
  IRTStorage rhs;
  IRTStorage lhs;
  Label local_a0;
  Label local_80;
  IRTStorage local_60;
  IRTStorage local_48;
  
  this->block_finished_ = true;
  TemplateVisitor<IRT::IRTStorage>::Accept
            (&local_48,&this->super_TemplateVisitor<IRT::IRTStorage>,
             &jump_conditional_statement->left_operand_->super_BaseElement);
  TemplateVisitor<IRT::IRTStorage>::Accept
            (&local_60,&this->super_TemplateVisitor<IRT::IRTStorage>,
             &jump_conditional_statement->right_operand_->super_BaseElement);
  this_00 = (JumpConditionalStatement *)operator_new(0x60);
  type = jump_conditional_statement->operator_type_;
  local_a0.label_._M_dataplus._M_p = (pointer)&local_a0.label_.field_2;
  pcVar2 = (jump_conditional_statement->label_true_).label_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar2,
             pcVar2 + (jump_conditional_statement->label_true_).label_._M_string_length);
  paVar1 = &local_80.label_.field_2;
  pcVar2 = (jump_conditional_statement->label_false_).label_._M_dataplus._M_p;
  local_80.label_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar2,
             pcVar2 + (jump_conditional_statement->label_false_).label_._M_string_length);
  JumpConditionalStatement::JumpConditionalStatement
            (this_00,type,local_48.expression_,local_60.expression_,&local_a0,&local_80);
  (this->super_TemplateVisitor<IRT::IRTStorage>).tos_value_.statement_ = (Statement *)this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.label_._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.label_._M_dataplus._M_p,
                    local_80.label_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.label_._M_dataplus._M_p != &local_a0.label_.field_2) {
    operator_delete(local_a0.label_._M_dataplus._M_p,
                    local_a0.label_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BlockFormerVisitor::Visit(
    JumpConditionalStatement* jump_conditional_statement) {
  block_finished_ = true;

  IRTStorage lhs = Accept(jump_conditional_statement->left_operand_);
  IRTStorage rhs = Accept(jump_conditional_statement->right_operand_);

  tos_value_.statement_ = new JumpConditionalStatement(
      jump_conditional_statement->operator_type_, lhs.expression_,
      rhs.expression_, jump_conditional_statement->label_true_,
      jump_conditional_statement->label_false_);
}